

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void ptls_log__recalc_conn
               (int caller_locked,st_ptls_log_conn_state_t *conn,_func_char_ptr_void_ptr *get_sni,
               void *get_sni_arg)

{
  int iVar1;
  char *local_48;
  ulong local_40;
  size_t slot;
  char *sni;
  uint32_t new_active;
  void *get_sni_arg_local;
  _func_char_ptr_void_ptr *get_sni_local;
  st_ptls_log_conn_state_t *conn_local;
  int caller_locked_local;
  
  if (caller_locked == 0) {
    pthread_mutex_lock((pthread_mutex_t *)&logctx.mutex);
  }
  if ((conn->state).generation != ptls_log._generation) {
    sni._4_4_ = 0;
    if (get_sni == (_func_char_ptr_void_ptr *)0x0) {
      local_48 = (char *)0x0;
    }
    else {
      local_48 = (*get_sni)(get_sni_arg);
    }
    for (local_40 = 0; local_40 < 0x20; local_40 = local_40 + 1) {
      if ((logctx.conns[local_40].points != (char *)0x0) &&
         (conn->random_ < logctx.conns[local_40].sample_ratio)) {
        iVar1 = is_in_stringlist(logctx.conns[local_40].snis,local_48);
        if (iVar1 != 0) {
          iVar1 = is_in_addresslist(logctx.conns[local_40].addresses,&conn->address);
          if (iVar1 != 0) {
            sni._4_4_ = 1 << ((byte)local_40 & 0x1f) | sni._4_4_;
          }
        }
      }
    }
    (conn->state).active_conns = sni._4_4_;
    (conn->state).generation = ptls_log._generation;
  }
  if (caller_locked == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)&logctx.mutex);
  }
  return;
}

Assistant:

void ptls_log__recalc_conn(int caller_locked, struct st_ptls_log_conn_state_t *conn, const char *(*get_sni)(void *),
                           void *get_sni_arg)
{
    if (!caller_locked)
        pthread_mutex_lock(&logctx.mutex);

    if (conn->state.generation != ptls_log._generation) {
        /* update active bitmap */
        uint32_t new_active = 0;
        const char *sni = get_sni != NULL ? get_sni(get_sni_arg) : NULL;
        for (size_t slot = 0; slot < PTLS_ELEMENTSOF(logctx.conns); ++slot) {
            if (logctx.conns[slot].points != NULL && conn->random_ < logctx.conns[slot].sample_ratio &&
                is_in_stringlist(logctx.conns[slot].snis, sni) && is_in_addresslist(logctx.conns[slot].addresses, &conn->address)) {
                new_active |= (uint32_t)1 << slot;
            }
        }
        conn->state.active_conns = new_active;
        conn->state.generation = ptls_log._generation;
    }

    if (!caller_locked)
        pthread_mutex_unlock(&logctx.mutex);
}